

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O1

void __thiscall
flatbuffers::cpp::CppGenerator::GenDefaultConstructor(CppGenerator *this,StructDef *struct_def)

{
  SymbolTable<flatbuffers::Value> *this_00;
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  CodeWriter *pCVar3;
  BaseType BVar4;
  FieldDef *field;
  StructDef *pSVar5;
  bool bVar6;
  mapped_type *pmVar7;
  const_iterator cVar8;
  long *plVar9;
  size_type *psVar10;
  pointer ppFVar11;
  undefined8 uVar12;
  _Alloc_hider _Var13;
  long lVar14;
  string initializer_list;
  string local_148;
  string local_128;
  key_type local_108;
  string local_e8;
  CppGenerator *local_c8;
  CodeWriter *local_c0;
  StructDef *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  paVar2 = &local_108.field_2;
  local_108._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"NATIVE_NAME","");
  EscapeKeyword(&local_128,this,(string *)struct_def);
  NativeName(&local_148,&local_128,struct_def,&(this->opts_).super_IDLOptions);
  pCVar3 = &this->code_;
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&pCVar3->value_map_,&local_108);
  std::__cxx11::string::_M_assign((string *)pmVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar2) {
    operator_delete(local_108._M_dataplus._M_p,
                    CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                             local_108.field_2._M_local_buf[0]) + 1);
  }
  if (*(int *)&(this->opts_).super_IDLOptions.field_0x30c < 1) {
    local_108._M_string_length = 0;
    local_108.field_2._M_local_buf[0] = '\0';
    ppFVar11 = (struct_def->fields).vec.
               super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_108._M_dataplus._M_p = (pointer)paVar2;
    local_c8 = this;
    local_c0 = pCVar3;
    pSVar5 = struct_def;
    if (ppFVar11 !=
        (struct_def->fields).vec.
        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      do {
        local_b8 = pSVar5;
        field = *ppFVar11;
        if ((field->deprecated == false) && ((field->value).type.base_type != BASE_TYPE_UTYPE)) {
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"cpp_type","");
          this_00 = &(field->super_Definition).attributes;
          cVar8 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                          *)this_00,&local_148);
          p_Var1 = &(field->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)cVar8._M_node == p_Var1) {
            bVar6 = true;
          }
          else {
            bVar6 = *(long *)(cVar8._M_node + 2) == 0;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"native_default","");
          cVar8 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                          *)this_00,&local_148);
          if ((_Rb_tree_header *)cVar8._M_node == p_Var1) {
            lVar14 = 0;
          }
          else {
            lVar14 = *(long *)(cVar8._M_node + 2);
          }
          paVar2 = &local_148.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != paVar2) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
          BVar4 = (field->value).type.base_type;
          if (BVar4 - BASE_TYPE_UTYPE < 0xc) {
            if (local_108._M_string_length != 0) {
              std::__cxx11::string::append((char *)&local_108);
            }
            Name_abi_cxx11_(&local_148,local_c8,field);
            std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_148._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != paVar2) {
              operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1
                             );
            }
            if (lVar14 == 0) {
              GetDefaultScalarValue_abi_cxx11_(&local_e8,local_c8,field,true);
            }
            else {
              local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_e8,*(long *)(lVar14 + 0x20),
                         *(long *)(lVar14 + 0x28) + *(long *)(lVar14 + 0x20));
            }
            plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,0x388ad9);
            psVar10 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_128.field_2._M_allocated_capacity = *psVar10;
              local_128.field_2._8_8_ = plVar9[3];
              local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
            }
            else {
              local_128.field_2._M_allocated_capacity = *psVar10;
              local_128._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_128._M_string_length = plVar9[1];
            *plVar9 = (long)psVar10;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_128);
            psVar10 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_148.field_2._M_allocated_capacity = *psVar10;
              local_148.field_2._8_8_ = plVar9[3];
              local_148._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              local_148.field_2._M_allocated_capacity = *psVar10;
              local_148._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_148._M_string_length = plVar9[1];
            *plVar9 = (long)psVar10;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_148._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != paVar2) {
              operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1
                             );
            }
            uVar12 = local_e8.field_2._M_allocated_capacity;
            _Var13._M_p = local_e8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
LAB_00197d55:
              operator_delete(_Var13._M_p,uVar12 + 1);
            }
          }
          else if (BVar4 == BASE_TYPE_STRUCT) {
            if ((lVar14 != 0) && (((field->value).type.struct_def)->fixed != false)) {
              if (local_108._M_string_length != 0) {
                std::__cxx11::string::append((char *)&local_108);
              }
              Name_abi_cxx11_(&local_70,local_c8,field);
              plVar9 = (long *)std::__cxx11::string::append((char *)&local_70);
              local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
              psVar10 = (size_type *)(plVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar10) {
                local_e8.field_2._M_allocated_capacity = *psVar10;
                local_e8.field_2._8_8_ = plVar9[3];
              }
              else {
                local_e8.field_2._M_allocated_capacity = *psVar10;
                local_e8._M_dataplus._M_p = (pointer)*plVar9;
              }
              local_e8._M_string_length = plVar9[1];
              *plVar9 = (long)psVar10;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              plVar9 = (long *)std::__cxx11::string::_M_append
                                         ((char *)&local_e8,*(ulong *)(lVar14 + 0x20));
              psVar10 = (size_type *)(plVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar10) {
                local_128.field_2._M_allocated_capacity = *psVar10;
                local_128.field_2._8_8_ = plVar9[3];
                local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
              }
              else {
                local_128.field_2._M_allocated_capacity = *psVar10;
                local_128._M_dataplus._M_p = (pointer)*plVar9;
              }
              local_128._M_string_length = plVar9[1];
              *plVar9 = (long)psVar10;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              plVar9 = (long *)std::__cxx11::string::append((char *)&local_128);
              psVar10 = (size_type *)(plVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar10) {
                local_148.field_2._M_allocated_capacity = *psVar10;
                local_148.field_2._8_8_ = plVar9[3];
                local_148._M_dataplus._M_p = (pointer)paVar2;
              }
              else {
                local_148.field_2._M_allocated_capacity = *psVar10;
                local_148._M_dataplus._M_p = (pointer)*plVar9;
              }
              local_148._M_string_length = plVar9[1];
              *plVar9 = (long)psVar10;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_148._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148._M_dataplus._M_p != paVar2) {
                operator_delete(local_148._M_dataplus._M_p,
                                local_148.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_128._M_dataplus._M_p != &local_128.field_2) {
                operator_delete(local_128._M_dataplus._M_p,
                                local_128.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1
                               );
              }
              uVar12 = local_70.field_2._M_allocated_capacity;
              _Var13._M_p = local_70._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != &local_70.field_2) goto LAB_00197d55;
            }
          }
          else if (((!bVar6) && (BVar4 != BASE_TYPE_VECTOR)) && (BVar4 != BASE_TYPE_VECTOR64)) {
            if (local_108._M_string_length != 0) {
              std::__cxx11::string::append((char *)&local_108);
            }
            Name_abi_cxx11_(&local_128,local_c8,field);
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_128);
            psVar10 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_148.field_2._M_allocated_capacity = *psVar10;
              local_148.field_2._8_8_ = plVar9[3];
              local_148._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              local_148.field_2._M_allocated_capacity = *psVar10;
              local_148._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_148._M_string_length = plVar9[1];
            *plVar9 = (long)psVar10;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_148._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != paVar2) {
              operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1
                             );
            }
            uVar12 = local_128.field_2._M_allocated_capacity;
            _Var13._M_p = local_128._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) goto LAB_00197d55;
          }
        }
        ppFVar11 = ppFVar11 + 1;
        pSVar5 = local_b8;
      } while (ppFVar11 !=
               (local_b8->fields).vec.
               super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    pCVar3 = local_c0;
    if (local_108._M_string_length != 0) {
      std::operator+(&local_148,"\n      : ",&local_108);
      std::__cxx11::string::operator=((string *)&local_108,(string *)&local_148);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
    }
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"INIT_LIST","");
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&pCVar3->value_map_,&local_148);
    std::__cxx11::string::_M_assign((string *)pmVar7);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"  {{NATIVE_NAME}}(){{INIT_LIST}} {","");
    CodeWriter::operator+=(pCVar3,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"  }","");
    CodeWriter::operator+=(pCVar3,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p == &local_108.field_2) {
      return;
    }
    local_50.field_2._M_allocated_capacity =
         CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,local_108.field_2._M_local_buf[0]);
    _Var13._M_p = local_108._M_dataplus._M_p;
  }
  else {
    bVar6 = NeedsCopyCtorAssignOp(this,struct_def);
    if (!bVar6) {
      return;
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"  {{NATIVE_NAME}}() = default;","");
    CodeWriter::operator+=(pCVar3,&local_50);
    _Var13._M_p = local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return;
    }
  }
  operator_delete(_Var13._M_p,local_50.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void GenDefaultConstructor(const StructDef &struct_def) {
    code_.SetValue("NATIVE_NAME",
                   NativeName(Name(struct_def), &struct_def, opts_));
    // In >= C++11, default member initializers are generated. To allow for
    // aggregate initialization, do not emit a default constructor at all, with
    // the exception of types that need a copy/move ctors and assignment
    // operators.
    if (opts_.g_cpp_std >= cpp::CPP_STD_11) {
      if (NeedsCopyCtorAssignOp(struct_def)) {
        code_ += "  {{NATIVE_NAME}}() = default;";
      }
      return;
    }
    std::string initializer_list;
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const auto &field = **it;
      if (!field.deprecated &&  // Deprecated fields won't be accessible.
          field.value.type.base_type != BASE_TYPE_UTYPE) {
        auto cpp_type = field.attributes.Lookup("cpp_type");
        auto native_default = field.attributes.Lookup("native_default");
        // Scalar types get parsed defaults, raw pointers get nullptrs.
        if (IsScalar(field.value.type.base_type)) {
          if (!initializer_list.empty()) { initializer_list += ",\n        "; }
          initializer_list += Name(field);
          initializer_list +=
              "(" +
              (native_default ? std::string(native_default->constant)
                              : GetDefaultScalarValue(field, true)) +
              ")";
        } else if (field.value.type.base_type == BASE_TYPE_STRUCT) {
          if (IsStruct(field.value.type)) {
            if (native_default) {
              if (!initializer_list.empty()) {
                initializer_list += ",\n        ";
              }
              initializer_list +=
                  Name(field) + "(" + native_default->constant + ")";
            }
          }
        } else if (cpp_type && !IsVector(field.value.type)) {
          if (!initializer_list.empty()) { initializer_list += ",\n        "; }
          initializer_list += Name(field) + "(0)";
        }
      }
    }
    if (!initializer_list.empty()) {
      initializer_list = "\n      : " + initializer_list;
    }

    code_.SetValue("INIT_LIST", initializer_list);

    code_ += "  {{NATIVE_NAME}}(){{INIT_LIST}} {";
    code_ += "  }";
  }